

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testEntity(DOMTest *this,DOMDocument *document)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  DOMNode *pDVar5;
  wchar16 *pwVar6;
  wchar16 *pwVar7;
  long lVar8;
  DOMDocument *pDVar9;
  DOMNode *pDVar10;
  DOMNode *pDVar11;
  XMLCh *pXVar12;
  DOMDocument *pDVar13;
  
  xercesc_4_0::XMLString::transcode
            ("ourEntityNode",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar4 = (long *)(**(code **)(*(long *)document + 0x58))(document);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x148))(plVar4);
  pDVar5 = (DOMNode *)(**(code **)(*plVar4 + 0x20))(plVar4,tempStr);
  plVar4 = (long *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x10))(pDVar5);
  pwVar7 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
  iVar3 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
  if (((iVar3 == 0) && (lVar8 = (**(code **)(*(long *)pDVar5 + 0x18))(pDVar5), lVar8 != 0)) &&
     (lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4), lVar8 != 0)) {
    pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar5 + 0x18))(pDVar5);
    pwVar7 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
    iVar3 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
    bVar1 = true;
    if (iVar3 == 0) goto LAB_0011bb2b;
  }
  else {
    lVar8 = (**(code **)(*(long *)pDVar5 + 0x18))(pDVar5);
    if (lVar8 == 0) {
      lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
      bVar1 = true;
      if (lVar8 == 0) goto LAB_0011bb2b;
    }
  }
  fwrite("\'cloneNode\' did not clone the DOMEntity* node correctly",0x37,1,_stderr);
  bVar1 = false;
LAB_0011bb2b:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,0);
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar9 != document) {
    bVar1 = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0xe09);
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,pDVar5,0);
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pDVar5 != pDVar10) {
    bVar1 = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0xe10);
  }
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,tempStr2,0);
  pDVar11 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pDVar11 != (DOMNode *)tempStr2) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe18);
  }
  if (pDVar5 != pDVar10) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe1c);
  }
  if (pDVar5 == pDVar11) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe20);
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr3);
  if (lVar8 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe28);
  }
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar8 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe2e);
  }
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr,0,0);
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (pXVar12 != tempStr2) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe36);
  }
  if (lVar8 != 0) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe3a);
  }
  pDVar13 = (DOMDocument *)(**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,0,0);
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (pDVar9 != pDVar13) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe41);
  }
  if (lVar8 != 0) {
    bVar1 = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0xe45);
  }
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr);
  if (lVar8 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe4b);
  }
  lVar8 = (**(code **)(*(long *)pDVar5 + 0xf0))(pDVar5,tempStr2);
  if (lVar8 != 0) {
    bVar1 = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0xe4f);
  }
  (**(code **)(*(long *)pDVar5 + 0xe8))(pDVar5,tempStr2,document,&userhandler);
  pDVar10 = (DOMNode *)(**(code **)(*(long *)pDVar5 + 0x68))(pDVar5,1);
  if (userhandler.currentType != NODE_CLONED) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0xe57)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0xe57);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0xe57);
  }
  if (userhandler.currentSrc != pDVar5) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0xe57);
  }
  if (userhandler.currentDst != pDVar10) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0xe57);
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar11 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar5,1);
  if (userhandler.currentType != NODE_IMPORTED) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0xe5c)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0xe5c);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0xe5c);
  }
  if (userhandler.currentSrc != pDVar5) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0xe5c);
  }
  if (userhandler.currentDst != pDVar11) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0xe5c);
  }
  (**(code **)(*(long *)pDVar11 + 0xe8))(pDVar11,tempStr2,pDVar5,&userhandler);
  (**(code **)(*(long *)pDVar11 + 0x138))(pDVar11);
  if (userhandler.currentType != NODE_DELETED) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0xe61)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0xe61);
  }
  if ((DOMNode *)userhandler.currentData != pDVar5) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0xe61);
  }
  if (userhandler.currentSrc != (DOMNode *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0xe61);
  }
  if (userhandler.currentDst != (DOMNode *)0x0) {
    bVar1 = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0xe61);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if (cVar2 == '\0') {
    bVar1 = false;
    fprintf(_stderr,"isSameNode failed in line %i\n",0xe65);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xd8))(pDVar5,pDVar5);
  if (cVar2 != '\0') {
    bVar1 = false;
    fprintf(_stderr,"isSameNode failed in line %i\n",0xe69);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar10);
  if (cVar2 == '\0') {
    bVar1 = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0xe6f);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if (cVar2 == '\0') {
    bVar1 = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0xe74);
  }
  cVar2 = (**(code **)(*(long *)pDVar5 + 0xe0))(pDVar5,pDVar5);
  if (cVar2 != '\0') {
    bVar1 = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0xe78);
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar5,0,tempStr2);
  fprintf(_stderr,"Exceptions Test # %d: no Exception thrown->\n",0xd2);
  if (!bVar1) {
    puts("\n*****The DOMEntity* method calls listed above failed, all others worked correctly.*****"
        );
  }
  return bVar1;
}

Assistant:

bool DOMTest::testEntity(DOMDocument* document)
{
    DOMEntity* entity;
    DOMNode* node, *node2;
    bool OK = true;
// For debugging*****   printf("\n          testEntity's outputs:\n\n");
    XMLString::transcode("ourEntityNode", tempStr, 3999);
    DOMNode*  abc20 = document->getDoctype()->getEntities()->getNamedItem(tempStr);
    entity = (DOMEntity*) abc20;
    node = entity;
    node2 = entity->cloneNode(true);
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(node->getNodeName(), node2->getNodeName()) &&        // Compares node names for equality
          (node->getNodeValue() != 0 && node2->getNodeValue() != 0)     // Checks to make sure each node has a value node
        ? !XMLString::compareString(node->getNodeValue(), node2->getNodeValue())         // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && node2->getNodeValue() == 0)))   // If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMEntity* node correctly");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument

    // Test the user data
    // Test simple set and get
    DOMEntity* userTest = entity;
    DOMNode*  userFirst = node;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(userFirst)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 210 );

    if (!OK)
        printf("\n*****The DOMEntity* method calls listed above failed, all others worked correctly.*****\n");
    return OK;
}